

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O2

pool_info_t new_pool(int block_size)

{
  pool_info_t ppVar1;
  pool_node_t *pppVar2;
  
  ppVar1 = (pool_info_t)malloc(0x10);
  ppVar1->block_size = block_size;
  pppVar2 = (pool_node_t *)prf_array_init(8,8);
  ppVar1->blocks = pppVar2;
  return ppVar1;
}

Assistant:

static
pool_info_t
new_pool(
    int block_size )
{
    pool_info_t pool;

    pool = (pool_info_t)malloc( sizeof( struct pool_info_s ) );
    assert( pool != NULL );
    pool->block_size = block_size;
    pool->blocks = (pool_node_t *)prf_array_init( 8, sizeof( pool_info_t ) );
    assert( pool->blocks != NULL );

    return pool;
}